

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O2

RC __thiscall SM_Manager::SetUpPrint(SM_Manager *this,RelCatEntry *rEntry,DataAttrInfo *attributes)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  DataAttrInfo *pDVar5;
  AttrType AVar6;
  RC RVar7;
  int i;
  int iVar8;
  RID attrRID;
  AttrCatEntry *aEntry;
  RM_Record attrRec;
  SM_AttrIterator attrIt;
  RID local_c0;
  AttrCatEntry *local_b8;
  RM_Record local_b0;
  SM_AttrIterator local_98;
  
  RID::RID(&local_c0);
  RM_Record::RM_Record(&local_b0);
  SM_AttrIterator::SM_AttrIterator(&local_98);
  RVar7 = SM_AttrIterator::OpenIterator(&local_98,&this->attrcatFH,rEntry->relName);
  if (RVar7 == 0) {
    for (iVar8 = 0; iVar8 < rEntry->attrCount; iVar8 = iVar8 + 1) {
      RVar7 = SM_AttrIterator::GetNextAttr(&local_98,&local_b0,&local_b8);
      if (RVar7 != 0) goto LAB_00108d0a;
      iVar1 = local_b8->attrNum;
      uVar2 = *(undefined8 *)local_b8->relName;
      uVar3 = *(undefined8 *)(local_b8->relName + 8);
      uVar4 = *(undefined8 *)(local_b8->relName + 0x11);
      *(undefined8 *)(attributes[iVar1].relName + 9) = *(undefined8 *)(local_b8->relName + 9);
      *(undefined8 *)(attributes[iVar1].relName + 9 + 8) = uVar4;
      *(undefined8 *)attributes[iVar1].relName = uVar2;
      *(undefined8 *)(attributes[iVar1].relName + 8) = uVar3;
      uVar2 = *(undefined8 *)(local_b8->attrName + 8);
      uVar3 = *(undefined8 *)(local_b8->attrName + 9);
      uVar4 = *(undefined8 *)(local_b8->attrName + 0x11);
      *(undefined8 *)attributes[iVar1].attrName = *(undefined8 *)local_b8->attrName;
      *(undefined8 *)(attributes[iVar1].attrName + 8) = uVar2;
      *(undefined8 *)(attributes[iVar1].attrName + 9) = uVar3;
      *(undefined8 *)(attributes[iVar1].attrName + 9 + 8) = uVar4;
      AVar6 = local_b8->attrType;
      uVar2 = *(undefined8 *)&local_b8->attrLength;
      pDVar5 = attributes + iVar1;
      pDVar5->offset = local_b8->offset;
      pDVar5->attrType = AVar6;
      *(undefined8 *)(&pDVar5->offset + 2) = uVar2;
    }
    RVar7 = SM_AttrIterator::CloseIterator(&local_98);
  }
LAB_00108d0a:
  SM_AttrIterator::~SM_AttrIterator(&local_98);
  RM_Record::~RM_Record(&local_b0);
  RID::~RID(&local_c0);
  return RVar7;
}

Assistant:

RC SM_Manager::SetUpPrint(RelCatEntry* rEntry, DataAttrInfo *attributes){
  RC rc = 0;
  RID attrRID;
  RM_Record attrRec;
  AttrCatEntry *aEntry;

  // Iterate through attrcat for attributes related to this relation
  SM_AttrIterator attrIt;
  if((rc = attrIt.OpenIterator(attrcatFH, rEntry->relName)))
    return (rc);

  for(int i=0; i < rEntry->attrCount; i++){
    if((rc = attrIt.GetNextAttr(attrRec, aEntry))){
      return (rc);
    }
    int slot = aEntry->attrNum; // insert its info in the appropriate slot

    memcpy(attributes[slot].relName, aEntry->relName, MAXNAME + 1);
    memcpy(attributes[slot].attrName, aEntry->attrName, MAXNAME + 1);
    attributes[slot].offset = aEntry->offset;
    attributes[slot].attrType = aEntry->attrType;
    attributes[slot].attrLength = aEntry->attrLength;
    attributes[slot].indexNo = aEntry->indexNo;
  }
  if((rc = attrIt.CloseIterator()))
    return (rc);

  return (rc);
}